

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint aom_highbd_8_obmc_variance64x16_c
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  lVar8 = (long)pre * 2;
  iVar14 = 0;
  uVar10 = 0;
  iVar9 = 0;
  do {
    iVar15 = 0;
    iVar16 = 0;
    iVar17 = 0;
    iVar11 = 0;
    iVar12 = 0;
    iVar13 = 0;
    lVar7 = 0;
    do {
      piVar1 = wsrc + lVar7;
      uVar2 = *(ulong *)(lVar8 + lVar7 * 2);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar2;
      auVar3._12_2_ = (short)(uVar2 >> 0x30);
      auVar4._8_2_ = (short)(uVar2 >> 0x20);
      auVar4._0_8_ = uVar2;
      auVar4._10_4_ = auVar3._10_4_;
      auVar6._6_8_ = 0;
      auVar6._0_6_ = auVar4._8_6_;
      auVar5._4_2_ = (short)(uVar2 >> 0x10);
      auVar5._0_4_ = (uint)uVar2;
      auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
      auVar24 = *(undefined1 (*) [16])(mask + lVar7);
      iVar18 = *piVar1 - auVar24._0_4_ * ((uint)uVar2 & 0xffff);
      iVar20 = piVar1[1] - auVar5._4_4_ * auVar24._4_4_;
      iVar21 = piVar1[2] - (int)((auVar24._8_8_ & 0xffffffff) * ((ulong)auVar4._8_6_ & 0xffffffff));
      iVar22 = piVar1[3] - (auVar3._10_4_ >> 0x10) * auVar24._12_4_;
      auVar23._0_4_ = -(uint)(iVar18 < 0);
      auVar23._4_4_ = -(uint)(iVar20 < 0);
      auVar23._8_4_ = -(uint)(iVar21 < 0);
      auVar23._12_4_ = -(uint)(iVar22 < 0);
      auVar24._0_4_ = iVar18 + 0x800U >> 0xc;
      auVar24._4_4_ = iVar20 + 0x800U >> 0xc;
      auVar24._8_4_ = iVar21 + 0x800U >> 0xc;
      auVar24._12_4_ = iVar22 + 0x800U >> 0xc;
      auVar25._4_4_ = -(0x800U - iVar20 >> 0xc);
      auVar25._0_4_ = -(0x800U - iVar18 >> 0xc);
      auVar25._8_4_ = -(0x800U - iVar21 >> 0xc);
      auVar25._12_4_ = -(0x800U - iVar22 >> 0xc);
      auVar24 = ~auVar23 & auVar24 | auVar25 & auVar23;
      iVar18 = auVar24._0_4_;
      iVar14 = iVar14 + iVar18;
      iVar20 = auVar24._4_4_;
      iVar15 = iVar15 + iVar20;
      iVar16 = iVar16 + auVar24._8_4_;
      iVar21 = auVar24._12_4_;
      iVar17 = iVar17 + iVar21;
      auVar19._4_4_ = iVar20;
      auVar19._0_4_ = iVar20;
      auVar19._8_4_ = iVar21;
      auVar19._12_4_ = iVar21;
      uVar10 = uVar10 + iVar18 * iVar18;
      iVar11 = iVar11 + iVar20 * iVar20;
      iVar12 = iVar12 + (int)((auVar24._8_8_ & 0xffffffff) * (auVar24._8_8_ & 0xffffffff));
      iVar13 = iVar13 + (int)((auVar19._8_8_ & 0xffffffff) * (auVar19._8_8_ & 0xffffffff));
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x40);
    iVar14 = iVar17 + iVar15 + iVar16 + iVar14;
    uVar10 = iVar13 + iVar11 + iVar12 + uVar10;
    wsrc = wsrc + 0x40;
    mask = mask + 0x40;
    iVar9 = iVar9 + 1;
    lVar8 = lVar8 + (long)pre_stride * 2;
  } while (iVar9 != 0x10);
  *sse = uVar10;
  return uVar10 - (int)((ulong)((long)iVar14 * (long)iVar14) >> 10);
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}